

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

void nghttp2_session_del(nghttp2_session *session)

{
  nghttp2_mem *mem;
  nghttp2_inflight_settings *pnVar1;
  nghttp2_inflight_settings *ptr;
  long lVar2;
  
  if (session == (nghttp2_session *)0x0) {
    return;
  }
  mem = &session->mem;
  ptr = session->inflight_settings_head;
  while (ptr != (nghttp2_inflight_settings *)0x0) {
    pnVar1 = ptr->next;
    nghttp2_mem_free(mem,ptr->iv);
    nghttp2_mem_free(mem,ptr);
    ptr = pnVar1;
  }
  lVar2 = 0x148;
  do {
    nghttp2_pq_free((nghttp2_pq *)((long)&(session->streams).table + lVar2));
    lVar2 = lVar2 + 0x28;
  } while (lVar2 != 0x288);
  nghttp2_stream_free(&session->root);
  nghttp2_map_each_free(&session->streams,free_streams,session);
  nghttp2_map_free(&session->streams);
  ob_q_free(&session->ob_urgent,mem);
  ob_q_free(&session->ob_reg,mem);
  ob_q_free(&session->ob_syn,mem);
  active_outbound_item_reset(&session->aob,mem);
  session_inbound_frame_reset(session);
  nghttp2_hd_deflate_free(&session->hd_deflater);
  nghttp2_hd_inflate_free(&session->hd_inflater);
  nghttp2_bufs_free(&(session->aob).framebufs);
  nghttp2_mem_free(mem,session);
  return;
}

Assistant:

void nghttp2_session_del(nghttp2_session *session) {
  nghttp2_mem *mem;
  nghttp2_inflight_settings *settings;
  size_t i;

  if (session == NULL) {
    return;
  }

  mem = &session->mem;

  for (settings = session->inflight_settings_head; settings;) {
    nghttp2_inflight_settings *next = settings->next;
    inflight_settings_del(settings, mem);
    settings = next;
  }

  for (i = 0; i < NGHTTP2_EXTPRI_URGENCY_LEVELS; ++i) {
    nghttp2_pq_free(&session->sched[i].ob_data);
  }
  nghttp2_stream_free(&session->root);

  /* Have to free streams first, so that we can check
     stream->item->queued */
  nghttp2_map_each_free(&session->streams, free_streams, session);
  nghttp2_map_free(&session->streams);

  ob_q_free(&session->ob_urgent, mem);
  ob_q_free(&session->ob_reg, mem);
  ob_q_free(&session->ob_syn, mem);

  active_outbound_item_reset(&session->aob, mem);
  session_inbound_frame_reset(session);
  nghttp2_hd_deflate_free(&session->hd_deflater);
  nghttp2_hd_inflate_free(&session->hd_inflater);
  nghttp2_bufs_free(&session->aob.framebufs);
  nghttp2_mem_free(mem, session);
}